

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O1

uint64_t roaring64_iterator_read(roaring64_iterator_t *it,uint64_t *buf,uint64_t count)

{
  _Bool _Var1;
  _Bool _Var2;
  roaring_container_iterator_t rVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint16_t low16;
  uint16_t local_52;
  uint64_t local_50;
  uint32_t container_consumed;
  art_iterator_t *local_40;
  ulong local_38;
  
  local_40 = &it->art_it;
  uVar6 = 0;
  local_38 = count;
  while( true ) {
    if (it->has_value != true) {
      return uVar6;
    }
    uVar7 = local_38 - uVar6;
    if (local_38 < uVar6 || uVar7 == 0) break;
    uVar4 = *(it->art_it).value;
    low16 = (uint16_t)it->value;
    if (0xfffffffe < uVar7) {
      uVar7 = 0xffffffff;
    }
    _Var1 = container_iterator_read_into_uint64
                      (it->r->containers[uVar4 >> 8],(uint8_t)uVar4,&it->container_it,it->high48,buf
                       ,(uint32_t)uVar7,&container_consumed,&low16);
    uVar7 = (ulong)container_consumed;
    uVar6 = uVar6 + uVar7;
    if (_Var1) {
      it->has_value = true;
      it->value = (ulong)low16 | it->high48;
      local_50 = uVar6;
    }
    else {
      _Var2 = art_iterator_next(local_40);
      it->has_value = _Var2;
      if (_Var2) {
        uVar4 = (ulong)*(ushort *)((it->art_it).key + 4) << 0x20;
        uVar5 = (ulong)*(uint6 *)(it->art_it).key;
        it->high48 = (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                     (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
                     (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
        uVar4 = *(it->art_it).value;
        local_52 = 0;
        rVar3 = container_init_iterator(it->r->containers[uVar4 >> 8],(uint8_t)uVar4,&local_52);
        (it->container_it).index = rVar3.index;
        it->value = (ulong)local_52 | it->high48;
        it->has_value = true;
      }
    }
    buf = buf + uVar7;
    if (_Var1) {
      return local_50;
    }
  }
  return uVar6;
}

Assistant:

uint64_t roaring64_iterator_read(roaring64_iterator_t *it, uint64_t *buf,
                                 uint64_t count) {
    uint64_t consumed = 0;
    while (it->has_value && consumed < count) {
        uint32_t container_consumed;
        leaf_t leaf = (leaf_t)*it->art_it.value;
        uint16_t low16 = (uint16_t)it->value;
        uint32_t container_count = UINT32_MAX;
        if (count - consumed < (uint64_t)UINT32_MAX) {
            container_count = count - consumed;
        }
        bool has_value = container_iterator_read_into_uint64(
            get_container(it->r, leaf), get_typecode(leaf), &it->container_it,
            it->high48, buf, container_count, &container_consumed, &low16);
        consumed += container_consumed;
        buf += container_consumed;
        if (has_value) {
            it->has_value = true;
            it->value = it->high48 | low16;
            assert(consumed == count);
            return consumed;
        }
        it->has_value = art_iterator_next(&it->art_it);
        if (it->has_value) {
            roaring64_iterator_init_at_leaf_first(it);
        }
    }
    return consumed;
}